

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O1

work_item * wait_for_completion(thread_pool *thread_pool,size_t count)

{
  mtx_t *pmVar1;
  ulong uVar2;
  work_item *pwVar3;
  int iVar4;
  
  pmVar1 = &(thread_pool->queue).mutex;
  mtx_lock(pmVar1);
  (thread_pool->queue).done_target = count;
  do {
    if ((((thread_pool->queue).worked_on == 0) &&
        ((thread_pool->queue).first_item == (work_item *)0x0)) ||
       ((uVar2 = (thread_pool->queue).done_target, uVar2 != 0 &&
        (uVar2 <= (thread_pool->queue).done_count)))) break;
    iVar4 = cnd_wait(&(thread_pool->queue).done_cond,pmVar1);
  } while (iVar4 == 0);
  pwVar3 = (thread_pool->queue).done_items;
  (thread_pool->queue).done_items = (work_item *)0x0;
  (thread_pool->queue).done_count = 0;
  (thread_pool->queue).done_target = 0;
  mtx_unlock(pmVar1);
  return pwVar3;
}

Assistant:

struct work_item* wait_for_completion(struct thread_pool* thread_pool, size_t count) {
    struct work_queue* queue = &thread_pool->queue;
    struct work_item* done_items = NULL;
    mtx_lock(&queue->mutex);
    queue->done_target = count;
    while (true) {
        if (waiting_condition(queue) &&
            cnd_wait(&queue->done_cond, &queue->mutex) == thrd_success)
            continue;
        break;
    }
    done_items = queue->done_items;
    queue->done_items = NULL;
    queue->done_count = 0;
    queue->done_target = 0;
    mtx_unlock(&queue->mutex);
    return done_items;
}